

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs_lzmasdk.h
# Opt level: O2

SRes LookToRead_Read(void *pp,void *buf,size_t *size)

{
  SRes SVar1;
  ulong uVar2;
  ulong __n;
  
  uVar2 = *(long *)((long)pp + 0x30) - *(long *)((long)pp + 0x28);
  if (uVar2 == 0) {
    SVar1 = (*(code *)**(undefined8 **)((long)pp + 0x20))
                      (*(undefined8 **)((long)pp + 0x20),buf,size);
    return SVar1;
  }
  __n = *size;
  if (uVar2 < *size) {
    __n = uVar2;
  }
  memcpy(buf,(void *)((long)pp + *(long *)((long)pp + 0x28) + 0x38),__n);
  *(long *)((long)pp + 0x28) = *(long *)((long)pp + 0x28) + __n;
  *size = __n;
  return 0;
}

Assistant:

static SRes LookToRead_Read(void *pp, void *buf, size_t *size)
{
  CLookToRead *p = (CLookToRead *)pp;
  size_t rem = p->size - p->pos;
  if (rem == 0)
    return p->realStream->Read(p->realStream, buf, size);
  if (rem > *size)
    rem = *size;
  memcpy(buf, p->buf + p->pos, rem);
  p->pos += rem;
  *size = rem;
  return SZ_OK;
}